

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall vkt::sr::ShaderEvalContext::reset(ShaderEvalContext *this,float sx,float sy)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float v;
  float fVar7;
  float fVar8;
  float local_28 [4];
  undefined8 local_18;
  undefined8 uStack_10;
  
  (this->color).m_data[0] = 0.0;
  (this->color).m_data[1] = 0.0;
  (this->color).m_data[2] = 0.0;
  (this->color).m_data[3] = 1.0;
  this->isDiscarded = false;
  fVar7 = sx + sx + -1.0;
  fVar8 = sy + sy + -1.0;
  (this->coords).m_data[0] = fVar7;
  (this->coords).m_data[1] = fVar8;
  (this->coords).m_data[2] = fVar8 * 0.33 - fVar7;
  (this->coords).m_data[3] = fVar7 * -0.275 - fVar8;
  (this->unitCoords).m_data[0] = sx;
  (this->unitCoords).m_data[1] = sy;
  (this->unitCoords).m_data[2] = sx * 0.33 + sy * 0.5;
  (this->unitCoords).m_data[3] = sx * 0.5 + sy * 0.25;
  uVar1 = (uint)((ulong)((long)(this->m_quadGrid->m_userAttribTransforms).
                               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_quadGrid->m_userAttribTransforms).
                              super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar1) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      lVar4 = (long)(((this->m_quadGrid->m_userAttribTransforms).
                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data + lVar2;
      local_28[0] = sx;
      local_28[1] = sy;
      local_28[2] = 0.0;
      local_28[3] = 1.0;
      local_18 = 0;
      uStack_10 = 0;
      lVar5 = 0;
      do {
        fVar7 = 0.0;
        lVar6 = 0;
        do {
          fVar7 = fVar7 + *(float *)(lVar4 + lVar6 * 4) * *(float *)((long)local_28 + lVar6);
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0x10);
        *(float *)((long)&local_18 + lVar5 * 4) = fVar7;
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 4;
      } while (lVar5 != 4);
      *(undefined8 *)this->in[uVar3].m_data = local_18;
      *(undefined8 *)(this->in[uVar3].m_data + 2) = uStack_10;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x40;
    } while (uVar3 != (uVar1 & 0x7fffffff));
  }
  return;
}

Assistant:

void ShaderEvalContext::reset (float sx, float sy)
{
	// Clear old values
	color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
	isDiscarded	= false;

	// Compute coords
	coords		= m_quadGrid.getCoords(sx, sy);
	unitCoords	= m_quadGrid.getUnitCoords(sx, sy);

	// Compute user attributes.
	const int numAttribs = m_quadGrid.getNumUserAttribs();
	DE_ASSERT(numAttribs <= MAX_USER_ATTRIBS);
	for (int attribNdx = 0; attribNdx < numAttribs; attribNdx++)
		in[attribNdx] = m_quadGrid.getUserAttrib(attribNdx, sx, sy);
}